

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

void VW::dealloc_example(_func_void_void_ptr *delete_label,example *ec,
                        _func_void_void_ptr *delete_prediction)

{
  long lVar1;
  
  if (delete_label != (_func_void_void_ptr *)0x0) {
    (*delete_label)(&ec->l);
  }
  if (delete_prediction != (_func_void_void_ptr *)0x0) {
    (*delete_prediction)(&ec->pred);
  }
  v_array<char>::delete_v(&ec->tag);
  if (ec->passthrough != (features *)0x0) {
    features::delete_v(ec->passthrough);
    operator_delete(ec->passthrough);
  }
  for (lVar1 = 0x20; lVar1 != 0x6820; lVar1 = lVar1 + 0x68) {
    features::delete_v((features *)((long)(ec->super_example_predict).feature_space + lVar1 + -0x20)
                      );
  }
  v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)ec);
  return;
}

Assistant:

void dealloc_example(void (*delete_label)(void*), example& ec, void (*delete_prediction)(void*))
{
  if (delete_label)
    delete_label(&ec.l);

  if (delete_prediction)
    delete_prediction(&ec.pred);

  ec.tag.delete_v();

  if (ec.passthrough)
  {
    ec.passthrough->delete_v();
    delete ec.passthrough;
  }

  for (size_t j = 0; j < 256; j++) ec.feature_space[j].delete_v();

  ec.indices.delete_v();
}